

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDASetPreconditioner(void *ida_mem,IDALsPrecSetupFn psetup,IDALsPrecSolveFn psolve)

{
  int iVar1;
  int line;
  int error_code;
  char *msgfmt;
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IDAMem local_30;
  IDALsMem local_28;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetPreconditioner",&local_30,&local_28);
  if (iVar1 == 0) {
    local_28->pset = psetup;
    local_28->psolve = psolve;
    if (local_28->LS->ops->setpreconditioner ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
      error_code = -3;
      line = 0x1c0;
    }
    else {
      if (psetup != (IDALsPrecSetupFn)0x0) {
        psetup = idaLsPSetup;
      }
      if (psolve != (IDALsPrecSolveFn)0x0) {
        psolve = idaLsPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner(local_28->LS,local_30,psetup,psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -9;
      error_code = -9;
      line = 0x1cd;
    }
    IDAProcessError(local_30,error_code,line,"IDASetPreconditioner",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int IDASetPreconditioner(void* ida_mem, IDALsPrecSetupFn psetup,
                         IDALsPrecSolveFn psolve)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  SUNPSetupFn idals_psetup;
  SUNPSolveFn idals_psolve;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in IDALs interface */
  idals_mem->pset   = psetup;
  idals_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (idals_mem->LS->ops->setpreconditioner == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (IDALS_ILL_INPUT);
  }

  /* notify iterative linear solver to call IDALs interface routines */
  idals_psetup = (psetup == NULL) ? NULL : idaLsPSetup;
  idals_psolve = (psolve == NULL) ? NULL : idaLsPSolve;
  retval = SUNLinSolSetPreconditioner(idals_mem->LS, IDA_mem, idals_psetup,
                                      idals_psolve);
  if (retval != SUN_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (IDALS_SUNLS_FAIL);
  }

  return (IDALS_SUCCESS);
}